

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_array.hpp
# Opt level: O1

void __thiscall
suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
::~suffix_array(suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                *this)

{
  ~suffix_array(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~suffix_array() {}